

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

size_t Curl_conncache_bundle_size(connectdata *conn)

{
  size_t sVar1;
  size_t num;
  connectdata *conn_local;
  
  if (conn->data->share != (Curl_share *)0x0) {
    Curl_share_lock(conn->data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  sVar1 = conn->bundle->num_connections;
  if (conn->data->share != (Curl_share *)0x0) {
    Curl_share_unlock(conn->data,CURL_LOCK_DATA_CONNECT);
  }
  return sVar1;
}

Assistant:

size_t Curl_conncache_bundle_size(struct connectdata *conn)
{
  size_t num;
  CONN_LOCK(conn->data);
  num = conn->bundle->num_connections;
  CONN_UNLOCK(conn->data);
  return num;
}